

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O0

int EC_POINT_copy(EC_POINT *dst,EC_POINT *src)

{
  undefined4 local_4;
  
  if (*(long *)(*(long *)dst + 0x68) == 0) {
    local_4 = 0;
  }
  else if (*(long *)dst == *(long *)src) {
    if (dst == src) {
      local_4 = 1;
    }
    else {
      local_4 = (**(code **)(*(long *)dst + 0x68))(dst,src);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int EC_POINT_copy(EC_POINT *dest, const EC_POINT *src)
{
    if (dest->meth->point_copy == 0) {
        return 0;
    }
    if (dest->meth != src->meth) {
        return 0;
    }
    if (dest == src)
        return 1;
    return dest->meth->point_copy(dest, src);
}